

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_serialize_field
          (t_javame_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  pointer pcVar1;
  pointer pcVar2;
  int iVar3;
  t_type *ttype;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  t_struct *tstruct;
  char *pcVar6;
  string *__return_storage_ptr__;
  t_base_type *this_00;
  undefined1 auVar7 [12];
  string name;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(tfield->type_);
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&name,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar3 == '\0')) {
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
        if ((char)iVar3 == '\0') {
          pcVar1 = (prefix->_M_dataplus)._M_p;
          pcVar2 = (tfield->name_)._M_dataplus._M_p;
          __return_storage_ptr__ = &name;
          type_name_abi_cxx11_(__return_storage_ptr__,this,ttype,false,false,false);
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",pcVar1,pcVar2,
                 name._M_dataplus._M_p);
          goto LAB_00218a86;
        }
        std::operator+(&name,prefix,&tfield->name_);
        poVar4 = t_generator::indent((t_generator *)this,out);
        std::operator<<(poVar4,"oprot.");
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
        if ((char)iVar3 == '\0') {
          iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
          if ((char)iVar3 != '\0') {
            poVar4 = std::operator<<(out,"writeI32(");
            poVar4 = std::operator<<(poVar4,(string *)&name);
            std::operator<<(poVar4,");");
          }
        }
        else {
          this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
          switch(this_00) {
          case (t_base_type *)0x0:
            pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name)
            ;
            __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          case (t_base_type *)0x1:
            iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
            pcVar6 = "writeString(";
            if ((char)iVar3 != '\0') {
              pcVar6 = "writeBinary(";
            }
            break;
          case (t_base_type *)0x2:
            pcVar6 = "writeBool(";
            break;
          case (t_base_type *)0x3:
            pcVar6 = "writeByte(";
            break;
          case (t_base_type *)0x4:
            pcVar6 = "writeI16(";
            break;
          case (t_base_type *)0x5:
            pcVar6 = "writeI32(";
            break;
          case (t_base_type *)0x6:
            pcVar6 = "writeI64(";
            break;
          case (t_base_type *)0x7:
            pcVar6 = "writeDouble(";
            break;
          default:
            auVar7 = __cxa_allocate_exception(0x20);
            t_base_type::t_base_name_abi_cxx11_(&local_90,this_00,auVar7._8_4_);
            std::operator+(auVar7._0_8_,"compiler error: no Java name for base type ",&local_90);
            __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar4 = std::operator<<(out,pcVar6);
          poVar4 = std::operator<<(poVar4,(string *)&name);
          std::operator<<(poVar4,");");
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,"oprot.writeI32(");
        std::operator+(&name,prefix,&tfield->name_);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4,".getValue());");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      }
      __return_storage_ptr__ = &name;
    }
    else {
      std::operator+(&local_70,prefix,&tfield->name_);
      generate_serialize_container(this,out,ttype,&local_70);
      __return_storage_ptr__ = &local_70;
    }
  }
  else {
    std::operator+(&local_50,prefix,&tfield->name_);
    generate_serialize_struct(this,out,tstruct,&local_50);
    __return_storage_ptr__ = &local_50;
  }
LAB_00218a86:
  std::__cxx11::string::~string((string *)__return_storage_ptr__);
  return;
}

Assistant:

void t_javame_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_enum()) {
    indent(out) << "oprot.writeI32(" << prefix + tfield->get_name() << ".getValue());" << endl;
  } else if (type->is_base_type()) {
    string name = prefix + tfield->get_name();
    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no Java name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}